

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

double load_param(char *param,double default_val,char *func)

{
  char *__nptr;
  double dVar1;
  double dVar2;
  char *numend;
  char *local_28;
  
  local_28 = (char *)0x0;
  __nptr = getenv(param);
  if (__nptr == (char *)0x0) {
    dVar1 = ABS(default_val);
    dVar2 = default_val;
  }
  else {
    dVar2 = strtod(__nptr,&local_28);
    dVar1 = ABS(dVar2);
    if (local_28 == __nptr) goto LAB_00114ab5;
  }
  if (dVar1 != INFINITY) {
    return dVar2;
  }
LAB_00114ab5:
  fprintf(_stderr,"%s: %s was not a finite positve floating point number. Using default: %g\n",
          default_val,func,param);
  return default_val;
}

Assistant:

static double load_param(const char * param, double default_val, 
        const char * func ) 
{
    double result = HUGE_VAL;
    char * numend = NULL;
#if HAS_DUPENV_S_WIN32
    char * str = NULL;
    if (_dupenv_s( &str, NULL , param ))
        return default_val;
#else
    char * str = getenv(param);
#endif
    
    result = str?strtod( str, &numend ):default_val;
    
    if ( (str && numend == str) || result == HUGE_VAL 
            || result == -HUGE_VAL ) {
        result = default_val;
        fprintf(stderr, "%s: %s was not a finite positve "
                        "floating point number."
                        " Using default: %g\n", 
                        func, param, result );
    }
#if HAS_DUPENV_S_WIN32
    free(str);
#endif
    return result;
}